

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpServer::onThreadInitCallback(KcpWithTcpServer *this,KcpTcpEventLoop *loop)

{
  bool bVar1;
  KcpTcpEventLoop *loop_local;
  KcpWithTcpServer *this_local;
  
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_kcpConnectionCallback);
  if (bVar1) {
    KcpTcpEventLoop::setKcpConnectionCallback(loop,&this->m_kcpConnectionCallback);
  }
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_kcpMessageCallback);
  if (bVar1) {
    KcpTcpEventLoop::setKcpMessageCallback(loop,&this->m_kcpMessageCallback);
  }
  KcpTcpEventLoop::setKcpWriteCompleteCallback(loop,&this->m_kcpWriteCompleteCallback);
  KcpTcpEventLoop::setKcpMode(loop,this->m_kcpMode);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_threadInitCallback);
  if (bVar1) {
    std::function<void_(sznet::net::KcpTcpEventLoop_*)>::operator()
              (&this->m_threadInitCallback,loop);
  }
  return;
}

Assistant:

void KcpWithTcpServer::onThreadInitCallback(KcpTcpEventLoop* loop)
{
	if (m_kcpConnectionCallback)
	{
		loop->setKcpConnectionCallback(m_kcpConnectionCallback);
	}
	if (m_kcpMessageCallback)
	{
		loop->setKcpMessageCallback(m_kcpMessageCallback);
	}
	loop->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
	loop->setKcpMode(m_kcpMode);
	if (m_threadInitCallback)
	{
		m_threadInitCallback(loop);
	}
}